

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::~Taskflow(Taskflow *this)

{
  long in_RDI;
  
  std::
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  ::~queue((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
            *)0x150b1c);
  Graph::~Graph((Graph *)0x150b2a);
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  return;
}

Assistant:

~Taskflow() = default;